

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_utils.hpp
# Opt level: O3

optional<unsigned_long> __thiscall
graph_utils::
Dsu<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_graph::HashTableBased>
::Size(Dsu<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_graph::HashTableBased>
       *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u)

{
  iterator iVar1;
  ulong uVar2;
  ulong uVar3;
  _Storage<unsigned_long,_true> unaff_R14;
  optional<unsigned_long> oVar4;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> u_rep;
  undefined1 local_40 [32];
  bool local_20;
  
  Find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
       )local_40,this,u);
  uVar3 = CONCAT71((int7)((ulong)local_40 >> 8),local_20);
  uVar2 = uVar3 & 0xffffffff;
  if (local_20 == true) {
    iVar1 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->size_)._M_h,(key_type *)local_40);
    unaff_R14 = (_Storage<unsigned_long,_true>)
                ((_Storage<unsigned_long,_true> *)
                ((long)iVar1.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                       ._M_cur + 0x28))->_M_value;
    uVar2 = (ulong)local_20;
  }
  if ((uVar2 & 1) != 0) {
    local_20 = false;
    if ((undefined1 *)local_40._0_8_ != local_40 + 0x10) {
      operator_delete((void *)local_40._0_8_,local_40._16_8_ + 1);
    }
  }
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar3 & 0xffffffff;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = unaff_R14._M_value;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> Size(const Type& u) {
    if (auto u_rep = Find(u))
      return size_.find(*u_rep)->second;
    return {};
  }